

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void __thiscall FParser::SimpleEvaluate(FParser *this,svalue_t *returnvar,int n)

{
  tokentype_t tVar1;
  int iVar2;
  char *pcVar3;
  DFsVariable *this_00;
  double dp;
  DFsVariable *var;
  int n_local;
  svalue_t *returnvar_local;
  FParser *this_local;
  
  tVar1 = this->TokenType[n];
  if (tVar1 == name_) {
    this_00 = DFsScript::FindVariable(this->Script,this->Tokens[n]);
    if (this_00 == (DFsVariable *)0x0) {
      script_error("unknown variable \'%s\'\n",this->Tokens[n]);
    }
    else {
      DFsVariable::GetValue(this_00,returnvar);
    }
  }
  else if (tVar1 == number) {
    pcVar3 = strchr(this->Tokens[n],0x2e);
    if (pcVar3 == (char *)0x0) {
      returnvar->type = 1;
      iVar2 = atoi(this->Tokens[n]);
      (returnvar->value).i = iVar2;
    }
    else {
      dp = atof(this->Tokens[n]);
      svalue_t::setDouble(returnvar,dp);
    }
  }
  else if (tVar1 == string_) {
    returnvar->type = 0;
    FString::operator=(&returnvar->string,this->Tokens[n]);
  }
  return;
}

Assistant:

void FParser::SimpleEvaluate(svalue_t &returnvar, int n)
{
	DFsVariable *var;
	
	switch(TokenType[n])
    {
    case string_: 
		returnvar.type = svt_string;
		returnvar.string = Tokens[n];
		break;
		
    case number:
		if(strchr(Tokens[n], '.'))
		{
			returnvar.setDouble(atof(Tokens[n]));
		}
		else
		{
			returnvar.type = svt_int;
			returnvar.value.i = atoi(Tokens[n]);
		}
		break;
		
    case name_:   
		var = Script->FindVariable(Tokens[n]);
		if(!var)
		{
			script_error("unknown variable '%s'\n", Tokens[n]);
		}
		else var->GetValue(returnvar);
		
    default: 
		break;
    }
}